

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

wchar_t * el_wgets(EditLine *el,wchar_t *nread)

{
  wchar_t *pwVar1;
  undefined4 *puVar2;
  byte bVar3;
  wchar_t wVar4;
  int iVar5;
  int *piVar6;
  wchar_t local_44;
  wchar_t local_34;
  wchar_t local_30;
  wchar_t nrb;
  wchar_t ch;
  wchar_t num;
  el_action_t cmdnum;
  wchar_t *pwStack_20;
  wchar_t retval;
  wchar_t *nread_local;
  EditLine *el_local;
  
  ch._3_1_ = 0;
  pwStack_20 = nread;
  if (nread == (wchar_t *)0x0) {
    pwStack_20 = &local_34;
  }
  nread_local = (wchar_t *)el;
  *pwStack_20 = L'\0';
  *(undefined4 *)(*(long *)(nread_local + 0x130) + 0x18) = 0;
  if ((nread_local[0xb] & 2U) == 0) {
    if ((nread_local[0xb] & 8U) == 0) {
      read_prepare((EditLine *)nread_local);
    }
    if ((nread_local[0xb] & 4U) == 0) {
      nrb = L'\xffffffff';
LAB_00114040:
      do {
        do {
          if ((nrb != L'\xffffffff') ||
             (wVar4 = read_getcmd((EditLine *)nread_local,(el_action_t *)((long)&ch + 3),&local_30),
             wVar4 == L'\xffffffff')) goto LAB_001142d0;
        } while (*(ulong *)(nread_local + 0x10e) <= (ulong)ch._3_1_);
        *(byte *)((long)nread_local + 0x81) = ch._3_1_;
        nread_local[0x21] = local_30;
        if (((nread_local[0x108] == L'\x01') &&
            (*(long *)(nread_local + 0x100) == *(long *)(nread_local + 0xfe))) &&
           (*(ulong *)(nread_local + 0xe8) < *(ulong *)(nread_local + 0xea))) {
          if (((ch._3_1_ == 0x3a) &&
              (*(long *)(nread_local + 0xe8) != *(long *)(nread_local + 0xe6))) &&
             (iVar5 = iswprint(*(wint_t *)(*(long *)(nread_local + 0xe8) + -4)), iVar5 != 0)) {
            *(long *)(nread_local + 0xe8) = *(long *)(nread_local + 0xe8) + -4;
          }
          else {
            pwVar1 = *(wchar_t **)(nread_local + 0xe8);
            *(wchar_t **)(nread_local + 0xe8) = pwVar1 + 1;
            *pwVar1 = local_30;
          }
        }
        bVar3 = (**(code **)(*(long *)(nread_local + 0x10c) + (ulong)ch._3_1_ * 8))
                          (nread_local,local_30);
        num = (wchar_t)bVar3;
        *(byte *)(nread_local + 0x20) = ch._3_1_;
        switch(num) {
        case L'\0':
          break;
        case L'\x01':
          nrb = (wchar_t)(*(long *)(nread_local + 0x18) - *(long *)(nread_local + 0x14) >> 2);
          break;
        case L'\x02':
          if ((nread_local[0xb] & 8U) == 0) {
            nrb = L'\0';
          }
          else if (nrb == L'\xffffffff') {
            puVar2 = *(undefined4 **)(nread_local + 0x18);
            *(undefined4 **)(nread_local + 0x18) = puVar2 + 1;
            *puVar2 = 4;
            *(undefined8 *)(nread_local + 0x16) = *(undefined8 *)(nread_local + 0x18);
            nrb = L'\x01';
          }
          break;
        case L'\x03':
          goto LAB_00114040;
        case L'\x05':
          re_refresh_cursor((EditLine *)nread_local);
          break;
        case L'\x06':
        default:
          terminal_beep((EditLine *)nread_local);
          terminal__flush((EditLine *)nread_local);
          break;
        case L'\a':
          re_clear_display((EditLine *)nread_local);
          ch_reset((EditLine *)nread_local);
          read_clearmacros(*(macros **)(nread_local + 0x130));
          re_refresh((EditLine *)nread_local);
          break;
        case L'\b':
          re_clear_lines((EditLine *)nread_local);
          re_clear_display((EditLine *)nread_local);
        case L'\x04':
          re_refresh((EditLine *)nread_local);
          break;
        case L'\t':
          re_refresh((EditLine *)nread_local);
          terminal_beep((EditLine *)nread_local);
        }
        nread_local[0x1e] = L'\x01';
        nread_local[0x1d] = L'\0';
        nread_local[0xf0] = L'\0';
      } while ((nread_local[0xb] & 8U) == 0);
LAB_001142d0:
      terminal__flush((EditLine *)nread_local);
      if ((nread_local[0xb] & 8U) == 0) {
        read_finish((EditLine *)nread_local);
        if (nrb == L'\xffffffff') {
          local_44 = L'\0';
        }
        else {
          local_44 = nrb;
        }
        *pwStack_20 = local_44;
      }
      else {
        *pwStack_20 = (wchar_t)(*(long *)(nread_local + 0x18) - *(long *)(nread_local + 0x14) >> 2);
      }
      if (*pwStack_20 == L'\0') {
        if ((nrb == L'\xffffffff') &&
           (*pwStack_20 = L'\xffffffff', *(int *)(*(long *)(nread_local + 0x130) + 0x18) != 0)) {
          iVar5 = *(int *)(*(long *)(nread_local + 0x130) + 0x18);
          piVar6 = __errno_location();
          *piVar6 = iVar5;
        }
        el_local = (EditLine *)0x0;
      }
      else {
        el_local = *(EditLine **)(nread_local + 0x14);
      }
    }
    else {
      if ((nread_local[0xb] & 8U) == 0) {
        *(undefined8 *)(nread_local + 0x18) = *(undefined8 *)(nread_local + 0x14);
      }
      terminal__flush((EditLine *)nread_local);
      el_local = (EditLine *)noedit_wgets((EditLine *)nread_local,pwStack_20);
    }
  }
  else {
    *(undefined8 *)(nread_local + 0x18) = *(undefined8 *)(nread_local + 0x14);
    el_local = (EditLine *)noedit_wgets((EditLine *)nread_local,pwStack_20);
  }
  return (wchar_t *)el_local;
}

Assistant:

const wchar_t *
el_wgets(EditLine *el, int *nread)
{
	int retval;
	el_action_t cmdnum = 0;
	int num;		/* how many chars we have read at NL */
	wchar_t ch;
	int nrb;

	if (nread == NULL)
		nread = &nrb;
	*nread = 0;
	el->el_read->read_errno = 0;

	if (el->el_flags & NO_TTY) {
		el->el_line.lastchar = el->el_line.buffer;
		return noedit_wgets(el, nread);
	}

#ifdef FIONREAD
	if (el->el_tty.t_mode == EX_IO && el->el_read->macros.level < 0) {
		int chrs = 0;

		(void) ioctl(el->el_infd, FIONREAD, &chrs);
		if (chrs == 0) {
			if (tty_rawmode(el) < 0) {
				errno = 0;
				*nread = 0;
				return NULL;
			}
		}
	}
#endif /* FIONREAD */

	if ((el->el_flags & UNBUFFERED) == 0)
		read_prepare(el);

	if (el->el_flags & EDIT_DISABLED) {
		if ((el->el_flags & UNBUFFERED) == 0)
			el->el_line.lastchar = el->el_line.buffer;
		terminal__flush(el);
		return noedit_wgets(el, nread);
	}

	for (num = -1; num == -1;) {  /* while still editing this line */
		/* if EOF or error */
		if (read_getcmd(el, &cmdnum, &ch) == -1)
			break;
		if ((size_t)cmdnum >= el->el_map.nfunc) /* BUG CHECK command */
			continue;	/* try again */
		/* now do the real command */
		/* vi redo needs these way down the levels... */
		el->el_state.thiscmd = cmdnum;
		el->el_state.thisch = ch;
		if (el->el_map.type == MAP_VI &&
		    el->el_map.current == el->el_map.key &&
		    el->el_chared.c_redo.pos < el->el_chared.c_redo.lim) {
			if (cmdnum == VI_DELETE_PREV_CHAR &&
			    el->el_chared.c_redo.pos != el->el_chared.c_redo.buf
			    && iswprint(el->el_chared.c_redo.pos[-1]))
				el->el_chared.c_redo.pos--;
			else
				*el->el_chared.c_redo.pos++ = ch;
		}
		retval = (*el->el_map.func[cmdnum]) (el, ch);

		/* save the last command here */
		el->el_state.lastcmd = cmdnum;

		/* use any return value */
		switch (retval) {
		case CC_CURSOR:
			re_refresh_cursor(el);
			break;

		case CC_REDISPLAY:
			re_clear_lines(el);
			re_clear_display(el);
			/* FALLTHROUGH */

		case CC_REFRESH:
			re_refresh(el);
			break;

		case CC_REFRESH_BEEP:
			re_refresh(el);
			terminal_beep(el);
			break;

		case CC_NORM:	/* normal char */
			break;

		case CC_ARGHACK:	/* Suggested by Rich Salz */
			/* <rsalz@pineapple.bbn.com> */
			continue;	/* keep going... */

		case CC_EOF:	/* end of file typed */
			if ((el->el_flags & UNBUFFERED) == 0)
				num = 0;
			else if (num == -1) {
				*el->el_line.lastchar++ = CONTROL('d');
				el->el_line.cursor = el->el_line.lastchar;
				num = 1;
			}
			break;

		case CC_NEWLINE:	/* normal end of line */
			num = (int)(el->el_line.lastchar - el->el_line.buffer);
			break;

		case CC_FATAL:	/* fatal error, reset to known state */
			/* put (real) cursor in a known place */
			re_clear_display(el);	/* reset the display stuff */
			ch_reset(el);	/* reset the input pointers */
			read_clearmacros(&el->el_read->macros);
			re_refresh(el); /* print the prompt again */
			break;

		case CC_ERROR:
		default:	/* functions we don't know about */
			terminal_beep(el);
			terminal__flush(el);
			break;
		}
		el->el_state.argument = 1;
		el->el_state.doingarg = 0;
		el->el_chared.c_vcmd.action = NOP;
		if (el->el_flags & UNBUFFERED)
			break;
	}

	terminal__flush(el);		/* flush any buffered output */
	/* make sure the tty is set up correctly */
	if ((el->el_flags & UNBUFFERED) == 0) {
		read_finish(el);
		*nread = num != -1 ? num : 0;
	} else
		*nread = (int)(el->el_line.lastchar - el->el_line.buffer);

	if (*nread == 0) {
		if (num == -1) {
			*nread = -1;
			if (el->el_read->read_errno)
				errno = el->el_read->read_errno;
		}
		return NULL;
	} else
		return el->el_line.buffer;
}